

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManGraphReportMemoryUsage(Nwk_Grf_t *p)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (p->nVertsMax + p->nObjs) * 4 + p->nEdgeHash * 8 + p->nEdges * 0x10 + 0xe0;
  p->nMemBytes1 = iVar1;
  iVar2 = p->nVerts * 0x10 + p->nEdges * 8;
  p->nMemBytes2 = iVar2;
  printf("Memory usage stats:  Preprocessing = %.2f MB.  Solving = %.2f MB.\n",
         (double)iVar1 * 9.5367431640625e-07,(double)iVar2 * 9.5367431640625e-07);
  return;
}

Assistant:

void Nwk_ManGraphReportMemoryUsage( Nwk_Grf_t * p )
{
    p->nMemBytes1 = 
        sizeof(Nwk_Grf_t) +
        sizeof(void *) * p->nEdgeHash + 
        sizeof(int) * (p->nObjs + p->nVertsMax) +
        sizeof(Nwk_Edg_t) * p->nEdges;
    p->nMemBytes2 = 
        sizeof(Nwk_Vrt_t) * p->nVerts + 
        sizeof(int) * 2 * p->nEdges;
    printf( "Memory usage stats:  Preprocessing = %.2f MB.  Solving = %.2f MB.\n",
        1.0 * p->nMemBytes1 / (1<<20), 1.0 * p->nMemBytes2 / (1<<20) );
}